

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transporter.cpp
# Opt level: O3

void __thiscall Transporter::~Transporter(Transporter *this)

{
  undefined **ppuVar1;
  
  ppuVar1 = &PTR__Transporter_0017f4d0;
  this->_vptr_Transporter = (_func_int **)&PTR__Transporter_0017f4d0;
  if (this->buf != (char *)0x0) {
    free(this->buf);
    ppuVar1 = this->_vptr_Transporter;
  }
  (*((_func_int **)ppuVar1)[2])(this);
  if ((this->thread)._M_id._M_thread != 0) {
    std::thread::join();
    if ((this->thread)._M_id._M_thread != 0) {
      std::terminate();
    }
  }
  return;
}

Assistant:

Transporter::~Transporter()
{
	if (buf)
	{
		free(buf);
	}
	Stop();
	if (thread.joinable())
		thread.join();
}